

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen12CachePolicy.cpp
# Opt level: O1

GMM_STATUS __thiscall GmmLib::GmmGen12CachePolicy::SetPATInitWA(GmmGen12CachePolicy *this)

{
  return GMM_ERROR;
}

Assistant:

GMM_STATUS GmmLib::GmmGen12CachePolicy::SetPATInitWA()
{
    GMM_STATUS Status   = GMM_SUCCESS;
    WA_TABLE * pWaTable = &const_cast<WA_TABLE &>(pGmmLibContext->GetWaTable());

#if(defined(__GMM_KMD__))
    __GMM_ASSERT(pGmmLibContext->GetSkuTable().FtrMemTypeMocsDeferPAT == 0x0); //MOCS.TargetCache supports eLLC only, PAT.TC -> reserved bits.
    pWaTable->WaGttPat0WB = 0;                                                 //Override PAT #0
#else
    Status = GMM_ERROR;
#endif

    return Status;
}